

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O0

Mat * generate_anchors(int base_size,Mat *ratios,Mat *scales)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  long *in_RCX;
  long *in_RDX;
  int in_ESI;
  Mat *in_RDI;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  float *anchor;
  float rs_h;
  float rs_w;
  float scale;
  int j;
  int r_h;
  int r_w;
  float ar;
  int i;
  float cy;
  float cx;
  int num_scale;
  int num_ratio;
  Mat *anchors;
  Allocator *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int local_d0;
  int local_c0;
  
  iVar1 = *(int *)((long)in_RDX + 0x2c);
  iVar2 = *(int *)((long)in_RCX + 0x2c);
  in_RDI->data = (void *)0x0;
  in_RDI->refcount = (int *)0x0;
  in_RDI->elemsize = 0;
  in_RDI->elempack = 0;
  in_RDI->allocator = (Allocator *)0x0;
  in_RDI->dims = 0;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->d = 0;
  in_RDI->c = 0;
  in_RDI->cstep = 0;
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffed8);
  for (local_c0 = 0; local_c0 < iVar1; local_c0 = local_c0 + 1) {
    fVar5 = *(float *)(*in_RDX + (long)local_c0 * 4);
    fVar4 = (float)in_ESI;
    dVar6 = std::sqrt((double)(ulong)(uint)fVar5);
    dVar6 = std::round((double)(ulong)(uint)(fVar4 / SUB84(dVar6,0)));
    dVar7 = std::round((double)(ulong)(uint)((float)(int)SUB84(dVar6,0) * fVar5));
    for (local_d0 = 0; local_d0 < iVar2; local_d0 = local_d0 + 1) {
      fVar5 = *(float *)(*in_RCX + (long)local_d0 * 4);
      fVar4 = (float)(int)SUB84(dVar6,0) * fVar5;
      fVar5 = (float)(int)SUB84(dVar7,0) * fVar5;
      pfVar3 = (float *)((long)in_RDI->data +
                        (long)in_RDI->w * (long)(local_c0 * iVar2 + local_d0) * in_RDI->elemsize);
      *pfVar3 = -fVar4 * 0.5 + (float)in_ESI * 0.5;
      pfVar3[1] = -fVar5 * 0.5 + (float)in_ESI * 0.5;
      pfVar3[2] = fVar4 * 0.5 + (float)in_ESI * 0.5;
      pfVar3[3] = fVar5 * 0.5 + (float)in_ESI * 0.5;
    }
  }
  return in_RDI;
}

Assistant:

static ncnn::Mat generate_anchors(int base_size, const ncnn::Mat& ratios, const ncnn::Mat& scales)
{
    int num_ratio = ratios.w;
    int num_scale = scales.w;

    ncnn::Mat anchors;
    anchors.create(4, num_ratio * num_scale);

    const float cx = base_size * 0.5f;
    const float cy = base_size * 0.5f;

    for (int i = 0; i < num_ratio; i++)
    {
        float ar = ratios[i];

        int r_w = round(base_size / sqrt(ar));
        int r_h = round(r_w * ar); //round(base_size * sqrt(ar));

        for (int j = 0; j < num_scale; j++)
        {
            float scale = scales[j];

            float rs_w = r_w * scale;
            float rs_h = r_h * scale;

            float* anchor = anchors.row(i * num_scale + j);

            anchor[0] = cx - rs_w * 0.5f;
            anchor[1] = cy - rs_h * 0.5f;
            anchor[2] = cx + rs_w * 0.5f;
            anchor[3] = cy + rs_h * 0.5f;
        }
    }

    return anchors;
}